

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSAOHDist_NECOF.cpp
# Opt level: O1

void __thiscall FSAOHDist_NECOF::~FSAOHDist_NECOF(FSAOHDist_NECOF *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  unsigned_long *puVar3;
  pointer ppuVar4;
  CPDDiscreteInterface *pCVar5;
  pointer puVar6;
  bool bVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  (this->super_FactoredStateAOHDistribution)._vptr_FactoredStateAOHDistribution =
       (_func_int **)&PTR__FSAOHDist_NECOF_005cd368;
  ppCVar1 = (this->_m_oHistConditional).
            super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (this->_m_oHistConditional).
            super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar11 = (long)ppCVar2 - (long)ppCVar1 >> 3;
  if ((long)(this->_m_stepsize).
            super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->_m_stepsize).
            super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
            super__Vector_impl_data._M_start == (long)ppCVar2 - (long)ppCVar1) {
    if (ppCVar2 != ppCVar1) {
      uVar8 = 0;
      uVar10 = 1;
      do {
        puVar3 = (this->_m_stepsize).
                 super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
        if (puVar3 != (unsigned_long *)0x0) {
          operator_delete__(puVar3);
        }
        bVar7 = uVar10 < uVar11;
        uVar8 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (bVar7);
    }
    ppuVar4 = (this->_m_stepsize).
              super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->_m_stepsize).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppuVar4) {
      (this->_m_stepsize).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppuVar4;
    }
  }
  if (ppCVar2 != ppCVar1) {
    uVar9 = 1;
    uVar8 = 0;
    do {
      ppCVar1 = (this->_m_oHistConditional).
                super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_oHistConditional).
                        super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      pCVar5 = ppCVar1[uVar8];
      if (pCVar5 != (CPDDiscreteInterface *)0x0) {
        (*pCVar5->_vptr_CPDDiscreteInterface[1])();
      }
      uVar8 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar8 < uVar11);
  }
  if (this->_m_sfacMarginals != (FSDist_COF *)0x0) {
    (*(this->_m_sfacMarginals->super_FactoredStateDistribution).super_StateDistribution.
      _vptr_StateDistribution[1])();
  }
  ppuVar4 = (this->_m_stepsize).
            super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppuVar4 != (pointer)0x0) {
    operator_delete(ppuVar4,(long)(this->_m_stepsize).
                                  super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppuVar4
                   );
  }
  puVar6 = (this->_m_sfacSoI_ii_size).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)(this->_m_sfacSoI_ii_size).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar6);
  }
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_sfacSoI);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->_m_oHistMarginals);
  ppCVar1 = (this->_m_oHistConditional).
            super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar1 != (pointer)0x0) {
    operator_delete(ppCVar1,(long)(this->_m_oHistConditional).
                                  super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar1
                   );
    return;
  }
  return;
}

Assistant:

FSAOHDist_NECOF::~FSAOHDist_NECOF()
{
    size_t nrAg = _m_oHistConditional.size();
    if(_m_stepsize.size()== nrAg)
    {
        for( Index agI=0; agI < nrAg; agI++)    
        {
            size_t * sz_arr = _m_stepsize[agI];
            if( sz_arr != 0)
                delete [] sz_arr;
        }
        _m_stepsize.clear();
    }

    for(Index agI=0; agI < nrAg; agI++)
        delete _m_oHistConditional.at(agI);

    delete _m_sfacMarginals;
}